

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  long lVar1;
  bool bVar2;
  unsigned_short *puVar3;
  long in_RDI;
  int j;
  ImDrawList *cmd_list;
  int i;
  ImVector<ImDrawVert> new_vtx_buffer;
  ImDrawVert *in_stack_ffffffffffffff98;
  ImDrawVert *in_stack_ffffffffffffffa0;
  int local_38;
  int local_1c;
  ImVector<ImDrawVert> local_18;
  
  ImVector<ImDrawVert>::ImVector(&local_18);
  *(undefined4 *)(in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x10); local_1c = local_1c + 1) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + (long)local_1c * 8);
    bVar2 = ImVector<unsigned_short>::empty((ImVector<unsigned_short> *)(lVar1 + 0x10));
    if (!bVar2) {
      ImVector<ImDrawVert>::resize
                ((ImVector<ImDrawVert> *)in_stack_ffffffffffffffa0,
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      for (local_38 = 0; local_38 < *(int *)(lVar1 + 0x10); local_38 = local_38 + 1) {
        puVar3 = ImVector<unsigned_short>::operator[]
                           ((ImVector<unsigned_short> *)(lVar1 + 0x10),local_38);
        in_stack_ffffffffffffffa0 =
             ImVector<ImDrawVert>::operator[]((ImVector<ImDrawVert> *)(lVar1 + 0x20),(uint)*puVar3);
        in_stack_ffffffffffffff98 = ImVector<ImDrawVert>::operator[](&local_18,local_38);
        in_stack_ffffffffffffff98->pos = in_stack_ffffffffffffffa0->pos;
        in_stack_ffffffffffffff98->uv = in_stack_ffffffffffffffa0->uv;
        in_stack_ffffffffffffff98->col = in_stack_ffffffffffffffa0->col;
      }
      ImVector<ImDrawVert>::swap((ImVector<ImDrawVert> *)(lVar1 + 0x20),&local_18);
      ImVector<unsigned_short>::resize
                ((ImVector<unsigned_short> *)in_stack_ffffffffffffffa0,
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      *(int *)(in_RDI + 0x18) = *(int *)(lVar1 + 0x20) + *(int *)(in_RDI + 0x18);
    }
  }
  ImVector<ImDrawVert>::~ImVector((ImVector<ImDrawVert> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void ImDrawData::DeIndexAllBuffers()
{
    ImVector<ImDrawVert> new_vtx_buffer;
    TotalVtxCount = TotalIdxCount = 0;
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        if (cmd_list->IdxBuffer.empty())
            continue;
        new_vtx_buffer.resize(cmd_list->IdxBuffer.Size);
        for (int j = 0; j < cmd_list->IdxBuffer.Size; j++)
            new_vtx_buffer[j] = cmd_list->VtxBuffer[cmd_list->IdxBuffer[j]];
        cmd_list->VtxBuffer.swap(new_vtx_buffer);
        cmd_list->IdxBuffer.resize(0);
        TotalVtxCount += cmd_list->VtxBuffer.Size;
    }
}